

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seed_rng.hpp
# Opt level: O1

void __thiscall boost::uuids::detail::seed_rng::sha1_random_digest_(seed_rng *this)

{
  runtime_error *prVar1;
  uchar *puVar2;
  int i;
  __pid_t _Var3;
  int iVar4;
  long lVar5;
  uint digest [5];
  timeval ts;
  uint *ps;
  seed_rng *this_ptr;
  runtime_error local_e8 [32];
  sha1 local_c8;
  timeval local_50;
  undefined4 *local_40;
  seed_rng *local_38;
  
  local_c8.h_[0] = 0x67452301;
  local_c8.h_[1] = 0xefcdab89;
  local_c8.h_[2] = 0x98badcfe;
  local_c8.h_[3] = 0x10325476;
  local_c8.h_[4] = 0xc3d2e1f0;
  local_c8.block_byte_index_ = 0;
  local_c8.bit_count_low = 0;
  local_c8.bit_count_high = 0;
  if ((FILE *)this->random_ != (FILE *)0x0) {
    fread(local_e8,1,0x14,(FILE *)this->random_);
    lVar5 = 0;
    do {
      prVar1 = (runtime_error *)(local_c8.block_ + local_c8.block_byte_index_);
      local_c8.block_byte_index_ = local_c8.block_byte_index_ + 1;
      *prVar1 = local_e8[lVar5];
      if (local_c8.block_byte_index_ == 0x40) {
        local_c8.block_byte_index_ = 0;
        sha1::process_block(&local_c8);
      }
      if (local_c8.bit_count_low < 0xfffffff8) {
        local_c8.bit_count_low = local_c8.bit_count_low + 8;
      }
      else {
        local_c8.bit_count_low = 0;
        if (0xfffffffe < local_c8.bit_count_high) {
          std::runtime_error::runtime_error((runtime_error *)&local_50,"sha1 too many bytes");
          exception_detail::throw_exception_<std::runtime_error>
                    ((runtime_error *)&local_50,
                     "void boost::uuids::detail::sha1::process_byte(unsigned char)",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Sleeplessy[P]ccel/third_party/boost/boost/uuid/detail/sha1.hpp"
                     ,0x6a);
        }
        local_c8.bit_count_high = local_c8.bit_count_high + 1;
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 != 0x14);
  }
  _Var3 = getpid();
  local_40 = (undefined4 *)CONCAT44(local_40._4_4_,_Var3);
  lVar5 = 0;
  do {
    puVar2 = local_c8.block_ + local_c8.block_byte_index_;
    local_c8.block_byte_index_ = local_c8.block_byte_index_ + 1;
    *puVar2 = *(uchar *)((long)&local_40 + lVar5);
    if (local_c8.block_byte_index_ == 0x40) {
      local_c8.block_byte_index_ = 0;
      sha1::process_block(&local_c8);
    }
    if (local_c8.bit_count_low < 0xfffffff8) {
      local_c8.bit_count_low = local_c8.bit_count_low + 8;
    }
    else {
      local_c8.bit_count_low = 0;
      if (0xfffffffe < local_c8.bit_count_high) {
        std::runtime_error::runtime_error(local_e8,"sha1 too many bytes");
        exception_detail::throw_exception_<std::runtime_error>
                  (local_e8,"void boost::uuids::detail::sha1::process_byte(unsigned char)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Sleeplessy[P]ccel/third_party/boost/boost/uuid/detail/sha1.hpp"
                   ,0x6a);
      }
      local_c8.bit_count_high = local_c8.bit_count_high + 1;
    }
    lVar5 = lVar5 + 1;
  } while (lVar5 != 4);
  lVar5 = 0;
  gettimeofday(&local_50,(__timezone_ptr_t)0x0);
  do {
    puVar2 = local_c8.block_ + local_c8.block_byte_index_;
    local_c8.block_byte_index_ = local_c8.block_byte_index_ + 1;
    *puVar2 = *(uchar *)((long)&local_50.tv_sec + lVar5);
    if (local_c8.block_byte_index_ == 0x40) {
      local_c8.block_byte_index_ = 0;
      sha1::process_block(&local_c8);
    }
    if (local_c8.bit_count_low < 0xfffffff8) {
      local_c8.bit_count_low = local_c8.bit_count_low + 8;
    }
    else {
      local_c8.bit_count_low = 0;
      if (0xfffffffe < local_c8.bit_count_high) {
        std::runtime_error::runtime_error(local_e8,"sha1 too many bytes");
        exception_detail::throw_exception_<std::runtime_error>
                  (local_e8,"void boost::uuids::detail::sha1::process_byte(unsigned char)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Sleeplessy[P]ccel/third_party/boost/boost/uuid/detail/sha1.hpp"
                   ,0x6a);
      }
      local_c8.bit_count_high = local_c8.bit_count_high + 1;
    }
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0x10);
  local_40 = &sha1_random_digest_state_()::state;
  lVar5 = 0;
  do {
    puVar2 = local_c8.block_ + local_c8.block_byte_index_;
    local_c8.block_byte_index_ = local_c8.block_byte_index_ + 1;
    *puVar2 = *(uchar *)((long)&sha1_random_digest_state_()::state + lVar5);
    if (local_c8.block_byte_index_ == 0x40) {
      local_c8.block_byte_index_ = 0;
      sha1::process_block(&local_c8);
    }
    if (local_c8.bit_count_low < 0xfffffff8) {
      local_c8.bit_count_low = local_c8.bit_count_low + 8;
    }
    else {
      local_c8.bit_count_low = 0;
      if (0xfffffffe < local_c8.bit_count_high) {
        std::runtime_error::runtime_error(local_e8,"sha1 too many bytes");
        exception_detail::throw_exception_<std::runtime_error>
                  (local_e8,"void boost::uuids::detail::sha1::process_byte(unsigned char)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Sleeplessy[P]ccel/third_party/boost/boost/uuid/detail/sha1.hpp"
                   ,0x6a);
      }
      local_c8.bit_count_high = local_c8.bit_count_high + 1;
    }
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0x14);
  lVar5 = 0;
  do {
    puVar2 = local_c8.block_ + local_c8.block_byte_index_;
    local_c8.block_byte_index_ = local_c8.block_byte_index_ + 1;
    *puVar2 = *(uchar *)((long)&local_40 + lVar5);
    if (local_c8.block_byte_index_ == 0x40) {
      local_c8.block_byte_index_ = 0;
      sha1::process_block(&local_c8);
    }
    if (local_c8.bit_count_low < 0xfffffff8) {
      local_c8.bit_count_low = local_c8.bit_count_low + 8;
    }
    else {
      local_c8.bit_count_low = 0;
      if (0xfffffffe < local_c8.bit_count_high) {
        std::runtime_error::runtime_error(local_e8,"sha1 too many bytes");
        exception_detail::throw_exception_<std::runtime_error>
                  (local_e8,"void boost::uuids::detail::sha1::process_byte(unsigned char)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Sleeplessy[P]ccel/third_party/boost/boost/uuid/detail/sha1.hpp"
                   ,0x6a);
      }
      local_c8.bit_count_high = local_c8.bit_count_high + 1;
    }
    lVar5 = lVar5 + 1;
  } while (lVar5 != 8);
  local_50.tv_sec = clock();
  lVar5 = 0;
  do {
    puVar2 = local_c8.block_ + local_c8.block_byte_index_;
    local_c8.block_byte_index_ = local_c8.block_byte_index_ + 1;
    *puVar2 = *(uchar *)((long)&local_50.tv_sec + lVar5);
    if (local_c8.block_byte_index_ == 0x40) {
      local_c8.block_byte_index_ = 0;
      sha1::process_block(&local_c8);
    }
    if (local_c8.bit_count_low < 0xfffffff8) {
      local_c8.bit_count_low = local_c8.bit_count_low + 8;
    }
    else {
      local_c8.bit_count_low = 0;
      if (0xfffffffe < local_c8.bit_count_high) {
        std::runtime_error::runtime_error(local_e8,"sha1 too many bytes");
        exception_detail::throw_exception_<std::runtime_error>
                  (local_e8,"void boost::uuids::detail::sha1::process_byte(unsigned char)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Sleeplessy[P]ccel/third_party/boost/boost/uuid/detail/sha1.hpp"
                   ,0x6a);
      }
      local_c8.bit_count_high = local_c8.bit_count_high + 1;
    }
    lVar5 = lVar5 + 1;
  } while (lVar5 != 8);
  iVar4 = rand();
  local_50.tv_sec = CONCAT44(local_50.tv_sec._4_4_,iVar4);
  iVar4 = rand();
  local_50.tv_sec = CONCAT44(iVar4,(undefined4)local_50.tv_sec);
  local_50.tv_usec._0_4_ = rand();
  lVar5 = 0;
  do {
    puVar2 = local_c8.block_ + local_c8.block_byte_index_;
    local_c8.block_byte_index_ = local_c8.block_byte_index_ + 1;
    *puVar2 = *(uchar *)((long)&local_50.tv_sec + lVar5);
    if (local_c8.block_byte_index_ == 0x40) {
      local_c8.block_byte_index_ = 0;
      sha1::process_block(&local_c8);
    }
    if (local_c8.bit_count_low < 0xfffffff8) {
      local_c8.bit_count_low = local_c8.bit_count_low + 8;
    }
    else {
      local_c8.bit_count_low = 0;
      if (0xfffffffe < local_c8.bit_count_high) {
        std::runtime_error::runtime_error(local_e8,"sha1 too many bytes");
        exception_detail::throw_exception_<std::runtime_error>
                  (local_e8,"void boost::uuids::detail::sha1::process_byte(unsigned char)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Sleeplessy[P]ccel/third_party/boost/boost/uuid/detail/sha1.hpp"
                   ,0x6a);
      }
      local_c8.bit_count_high = local_c8.bit_count_high + 1;
    }
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0xc);
  local_50.tv_sec = (__time_t)operator_new(4);
  lVar5 = 0;
  do {
    puVar2 = local_c8.block_ + local_c8.block_byte_index_;
    local_c8.block_byte_index_ = local_c8.block_byte_index_ + 1;
    *puVar2 = *(uchar *)((long)&local_50.tv_sec + lVar5);
    if (local_c8.block_byte_index_ == 0x40) {
      local_c8.block_byte_index_ = 0;
      sha1::process_block(&local_c8);
    }
    if (local_c8.bit_count_low < 0xfffffff8) {
      local_c8.bit_count_low = local_c8.bit_count_low + 8;
    }
    else {
      local_c8.bit_count_low = 0;
      if (0xfffffffe < local_c8.bit_count_high) {
        std::runtime_error::runtime_error(local_e8,"sha1 too many bytes");
        exception_detail::throw_exception_<std::runtime_error>
                  (local_e8,"void boost::uuids::detail::sha1::process_byte(unsigned char)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Sleeplessy[P]ccel/third_party/boost/boost/uuid/detail/sha1.hpp"
                   ,0x6a);
      }
      local_c8.bit_count_high = local_c8.bit_count_high + 1;
    }
    lVar5 = lVar5 + 1;
  } while (lVar5 != 8);
  if ((void *)local_50.tv_sec != (void *)0x0) {
    operator_delete((void *)local_50.tv_sec,4);
  }
  local_38 = this;
  lVar5 = 0;
  do {
    puVar2 = local_c8.block_ + local_c8.block_byte_index_;
    local_c8.block_byte_index_ = local_c8.block_byte_index_ + 1;
    *puVar2 = *(uchar *)((long)&local_38 + lVar5);
    if (local_c8.block_byte_index_ == 0x40) {
      local_c8.block_byte_index_ = 0;
      sha1::process_block(&local_c8);
    }
    if (local_c8.bit_count_low < 0xfffffff8) {
      local_c8.bit_count_low = local_c8.bit_count_low + 8;
    }
    else {
      local_c8.bit_count_low = 0;
      if (0xfffffffe < local_c8.bit_count_high) {
        std::runtime_error::runtime_error(local_e8,"sha1 too many bytes");
        exception_detail::throw_exception_<std::runtime_error>
                  (local_e8,"void boost::uuids::detail::sha1::process_byte(unsigned char)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Sleeplessy[P]ccel/third_party/boost/boost/uuid/detail/sha1.hpp"
                   ,0x6a);
      }
      local_c8.bit_count_high = local_c8.bit_count_high + 1;
    }
    lVar5 = lVar5 + 1;
  } while (lVar5 != 8);
  lVar5 = 0;
  do {
    puVar2 = local_c8.block_ + local_c8.block_byte_index_;
    local_c8.block_byte_index_ = local_c8.block_byte_index_ + 1;
    *puVar2 = *(uchar *)((long)this->rd_ + lVar5);
    if (local_c8.block_byte_index_ == 0x40) {
      local_c8.block_byte_index_ = 0;
      sha1::process_block(&local_c8);
    }
    if (local_c8.bit_count_low < 0xfffffff8) {
      local_c8.bit_count_low = local_c8.bit_count_low + 8;
    }
    else {
      local_c8.bit_count_low = 0;
      if (0xfffffffe < local_c8.bit_count_high) {
        std::runtime_error::runtime_error(local_e8,"sha1 too many bytes");
        exception_detail::throw_exception_<std::runtime_error>
                  (local_e8,"void boost::uuids::detail::sha1::process_byte(unsigned char)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Sleeplessy[P]ccel/third_party/boost/boost/uuid/detail/sha1.hpp"
                   ,0x6a);
      }
      local_c8.bit_count_high = local_c8.bit_count_high + 1;
    }
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0x14);
  sha1::get_digest(&local_c8,(digest_type *)local_e8);
  lVar5 = 0;
  do {
    local_40[lVar5] = local_40[lVar5] ^ *(uint *)(local_e8 + lVar5 * 4);
    this->rd_[lVar5] = this->rd_[lVar5] ^ *(uint *)(local_e8 + lVar5 * 4);
    lVar5 = lVar5 + 1;
  } while (lVar5 != 5);
  return;
}

Assistant:

void sha1_random_digest_()
    {
        boost::uuids::detail::sha1 sha;


        if (random_)
        {
            // intentionally left uninitialized
            unsigned char state[ 20 ];
#if defined(BOOST_WINDOWS)
            boost::winapi::CryptGenRandom(random_, sizeof(state), state);
#else
            ignore_size(std::fread( state, 1, sizeof(state), random_ ));
#endif
            sha.process_bytes( state, sizeof( state ) );
        }

        {
            // Getting enropy from some system specific sources
#if defined(BOOST_WINDOWS)
            boost::winapi::DWORD_ procid = boost::winapi::GetCurrentProcessId();
            sha.process_bytes( (unsigned char const*)&procid, sizeof( procid ) );

            boost::winapi::DWORD_ threadid = boost::winapi::GetCurrentThreadId();
            sha.process_bytes( (unsigned char const*)&threadid, sizeof( threadid ) );

            boost::winapi::LARGE_INTEGER_ ts;
            ts.QuadPart = 0;
            boost::winapi::QueryPerformanceCounter( &ts );
            sha.process_bytes( (unsigned char const*)&ts, sizeof( ts ) );

            std::time_t tm = std::time( 0 );
            sha.process_bytes( (unsigned char const*)&tm, sizeof( tm ) );
#else
            pid_t pid = getpid();
            sha.process_bytes( (unsigned char const*)&pid, sizeof( pid ) );

            timeval ts;
            gettimeofday(&ts, NULL); // We do not use `clock_gettime` to avoid linkage with -lrt
            sha.process_bytes( (unsigned char const*)&ts, sizeof( ts ) );
#endif
        }


        unsigned int * ps = sha1_random_digest_state_();
        sha.process_bytes( ps, internal_state_size * sizeof( unsigned int ) );
        sha.process_bytes( (unsigned char const*)&ps, sizeof( ps ) );

        {
            std::clock_t ck = std::clock();
            sha.process_bytes( (unsigned char const*)&ck, sizeof( ck ) );
        }

        {
            unsigned int rn[] =
                { static_cast<unsigned int>(std::rand())
                , static_cast<unsigned int>(std::rand())
                , static_cast<unsigned int>(std::rand())
                };
            sha.process_bytes( (unsigned char const*)rn, sizeof( rn ) );
        }

        {
            unsigned int * p = new unsigned int;
            sha.process_bytes( (unsigned char const*)&p, sizeof( p ) );
            delete p;

            const seed_rng* this_ptr = this;
            sha.process_bytes( (unsigned char const*)&this_ptr, sizeof( this_ptr ) );
        }

        sha.process_bytes( (unsigned char const*)rd_, sizeof( rd_ ) );

        unsigned int digest[ 5 ];
        sha.get_digest( digest );

        for( int i = 0; i < 5; ++i )
        {
            // harmless data race
            ps[ i ] ^= digest[ i ];
            rd_[ i ] ^= digest[ i ];
        }
    }